

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O2

void sad32x4(uint16_t *src_ptr,int src_stride,uint16_t *ref_ptr,int ref_stride,uint16_t *sec_ptr,
            __m256i *sad_acc)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  int iVar3;
  undefined1 (*pauVar4) [32];
  bool bVar5;
  __m256i r [4];
  __m256i s [4];
  __m256i local_160;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  longlong local_e0;
  longlong lStack_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  pauVar4 = (undefined1 (*) [32])(ref_ptr + 0x10);
  puVar2 = src_ptr + 0x10;
  iVar3 = 2;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    local_e0 = *(longlong *)(puVar2 + -0x10);
    lStack_d8 = *(longlong *)(puVar2 + -0xc);
    lStack_d0 = *(longlong *)(puVar2 + -8);
    lStack_c8 = *(longlong *)(puVar2 + -4);
    local_c0 = *(undefined8 *)puVar2;
    uStack_b8 = *(undefined8 *)(puVar2 + 4);
    uStack_b0 = *(undefined8 *)(puVar2 + 8);
    uStack_a8 = *(undefined8 *)(puVar2 + 0xc);
    puVar1 = puVar2 + (long)src_stride + -0x10;
    local_a0 = *(undefined8 *)puVar1;
    uStack_98 = *(undefined8 *)(puVar1 + 4);
    uStack_90 = *(undefined8 *)(puVar1 + 8);
    uStack_88 = *(undefined8 *)(puVar1 + 0xc);
    puVar1 = puVar2 + src_stride;
    local_80 = *(undefined8 *)puVar1;
    uStack_78 = *(undefined8 *)(puVar1 + 4);
    uStack_70 = *(undefined8 *)(puVar1 + 8);
    uStack_68 = *(undefined8 *)(puVar1 + 0xc);
    local_160 = *(__m256i *)(pauVar4 + -1);
    local_140 = *pauVar4;
    local_120 = *(undefined1 (*) [32])(pauVar4[-1] + (long)ref_stride * 2);
    local_100 = *(undefined1 (*) [32])(*pauVar4 + (long)ref_stride * 2);
    if ((undefined1 (*) [32])sec_ptr == (undefined1 (*) [32])0x0) {
      sec_ptr = (uint16_t *)0x0;
    }
    else {
      local_160 = (__m256i)vpavgw_avx2((undefined1  [32])local_160,*(undefined1 (*) [32])sec_ptr);
      local_140 = vpavgw_avx2(local_140,*(undefined1 (*) [32])((long)sec_ptr + 0x20));
      local_120 = vpavgw_avx2(local_120,*(undefined1 (*) [32])((long)sec_ptr + 0x40));
      local_100 = vpavgw_avx2(local_100,*(undefined1 (*) [32])((long)sec_ptr + 0x60));
      sec_ptr = (uint16_t *)((long)sec_ptr + 0x80);
    }
    highbd_sad16x4_core_avx2((__m256i *)&local_e0,&local_160,sad_acc);
    pauVar4 = (undefined1 (*) [32])(*pauVar4 + (long)(ref_stride * 2) * 2);
    puVar2 = puVar2 + src_stride * 2;
  }
  return;
}

Assistant:

static void sad32x4(const uint16_t *src_ptr, int src_stride,
                    const uint16_t *ref_ptr, int ref_stride,
                    const uint16_t *sec_ptr, __m256i *sad_acc) {
  __m256i s[4], r[4];
  int row_sections = 0;

  while (row_sections < 2) {
    s[0] = _mm256_loadu_si256((const __m256i *)src_ptr);
    s[1] = _mm256_loadu_si256((const __m256i *)(src_ptr + 16));
    s[2] = _mm256_loadu_si256((const __m256i *)(src_ptr + src_stride));
    s[3] = _mm256_loadu_si256((const __m256i *)(src_ptr + src_stride + 16));

    r[0] = _mm256_loadu_si256((const __m256i *)ref_ptr);
    r[1] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 16));
    r[2] = _mm256_loadu_si256((const __m256i *)(ref_ptr + ref_stride));
    r[3] = _mm256_loadu_si256((const __m256i *)(ref_ptr + ref_stride + 16));

    if (sec_ptr) {
      r[0] =
          _mm256_avg_epu16(r[0], _mm256_loadu_si256((const __m256i *)sec_ptr));
      r[1] = _mm256_avg_epu16(
          r[1], _mm256_loadu_si256((const __m256i *)(sec_ptr + 16)));
      r[2] = _mm256_avg_epu16(
          r[2], _mm256_loadu_si256((const __m256i *)(sec_ptr + 32)));
      r[3] = _mm256_avg_epu16(
          r[3], _mm256_loadu_si256((const __m256i *)(sec_ptr + 48)));
      sec_ptr += 32 << 1;
    }
    highbd_sad16x4_core_avx2(s, r, sad_acc);

    row_sections += 1;
    src_ptr += src_stride << 1;
    ref_ptr += ref_stride << 1;
  }
}